

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStructCmpxchg(PrintExpressionContents *this,StructCmpxchg *curr)

{
  HeapType type;
  HeapType heapType;
  StructCmpxchg *curr_local;
  PrintExpressionContents *this_local;
  
  prepareColor(this->o);
  std::operator<<(this->o,"struct.atomic.rmw.cmpxchg ");
  restoreNormalColor(this->o);
  printMemoryOrder(this,curr->order);
  printMemoryOrder(this,curr->order);
  type = wasm::Type::getHeapType(&curr->ref->type);
  printHeapTypeName(this,type);
  std::operator<<(this->o,' ');
  printFieldName(this,type,curr->index);
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
    prepareColor(o);
    o << "struct.atomic.rmw.cmpxchg ";
    restoreNormalColor(o);
    printMemoryOrder(curr->order);
    printMemoryOrder(curr->order);
    auto heapType = curr->ref->type.getHeapType();
    printHeapTypeName(heapType);
    o << ' ';
    printFieldName(heapType, curr->index);
  }